

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void __thiscall
duckdb::WindowQuantileState<double>::UpdateSkip
          (WindowQuantileState<double> *this,CursorType *data,SubFrames *frames,
          IncludedType *included)

{
  unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>,_true>
  *this_00;
  DataChunk *result;
  DataChunk *result_00;
  _Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
  _Var1;
  pointer pFVar2;
  unsigned_long *puVar3;
  CURSOR_TYPE *pCVar4;
  reference pvVar5;
  const_reference pvVar6;
  _Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
  _Var7;
  type this_01;
  reference pvVar8;
  ulong uVar9;
  SkipListType *seek_idx;
  SubFrames *this_02;
  FrameBounds *frame;
  pointer pFVar10;
  SkipListUpdater updater;
  SkipListUpdater local_48;
  
  this_00 = &this->s;
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
       *)0x0) {
    this_02 = &this->prevs;
    pvVar5 = vector<duckdb::FrameBounds,_true>::back(this_02);
    uVar9 = pvVar5->end;
    pvVar6 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar6->start < uVar9) {
      pvVar6 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar9 = pvVar6->end;
      pvVar5 = vector<duckdb::FrameBounds,_true>::front(this_02);
      if (pvVar5->start < uVar9) {
        if ((this_00->
            super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
            .
            super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
            ._M_head_impl ==
            (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
             *)0x0) {
          (this_00->
          super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
          .
          super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
          ._M_head_impl =
               (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
                *)0x0;
          _Var7._M_head_impl =
               (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
                *)operator_new(0x50);
          (_Var7._M_head_impl)->_vptr_HeadNode = (_func_int **)&PTR__HeadNode_019d3d48;
          *(Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
            **)((long)&(_Var7._M_head_impl)->_pool + 8) =
               (Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
                *)0x0;
          (_Var7._M_head_impl)->_count = 0;
          *(undefined8 *)&((_Var7._M_head_impl)->_nodeRefs)._nodes = 0;
          *(pointer *)((long)&(_Var7._M_head_impl)->_nodeRefs + 8) = (pointer)0x0;
          *(pointer *)((long)&(_Var7._M_head_impl)->_nodeRefs + 0x10) = (pointer)0x0;
          *(size_t *)((long)&(_Var7._M_head_impl)->_nodeRefs + 0x18) = 0;
          ((pcg32_fast *)((long)&(_Var7._M_head_impl)->_pool + 0x10))->state_ = 0xcafef00dd15ea5e7;
          _Var1._M_head_impl =
               (this_00->
               super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
               .
               super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
               ._M_head_impl;
          (this_00->
          super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
          .
          super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
          ._M_head_impl = _Var7._M_head_impl;
          if (_Var1._M_head_impl !=
              (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
               *)0x0) {
            (**(code **)((long)(_Var1._M_head_impl)->_vptr_HeadNode + 8))();
          }
        }
        local_48.skip =
             unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>,_true>
             ::operator*(this_00);
        local_48.data = data;
        local_48.included = included;
        AggregateExecutor::IntersectFrames<duckdb::WindowQuantileState<double>::SkipListUpdater>
                  (this_02,frames,&local_48);
        return;
      }
    }
  }
  _Var1._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
       .
       super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
       ._M_head_impl;
  (this_00->
  super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
  .
  super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
  ._M_head_impl =
       (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
        *)0x0;
  if (_Var1._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
       *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_HeadNode + 8))();
  }
  _Var7._M_head_impl =
       (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
        *)operator_new(0x50);
  (_Var7._M_head_impl)->_vptr_HeadNode = (_func_int **)&PTR__HeadNode_019d3d48;
  *(Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_> **)
   ((long)&(_Var7._M_head_impl)->_pool + 8) =
       (Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
        *)0x0;
  (_Var7._M_head_impl)->_count = 0;
  *(undefined8 *)&((_Var7._M_head_impl)->_nodeRefs)._nodes = 0;
  *(pointer *)((long)&(_Var7._M_head_impl)->_nodeRefs + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var7._M_head_impl)->_nodeRefs + 0x10) = (pointer)0x0;
  *(size_t *)((long)&(_Var7._M_head_impl)->_nodeRefs + 0x18) = 0;
  ((pcg32_fast *)((long)&(_Var7._M_head_impl)->_pool + 0x10))->state_ = 0xcafef00dd15ea5e7;
  _Var1._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
       .
       super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
       ._M_head_impl;
  (this_00->
  super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
  .
  super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_*,_false>
  ._M_head_impl = _Var7._M_head_impl;
  if (_Var1._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
       *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_HeadNode + 8))();
  }
  this_01 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>,_true>
            ::operator*(this_00);
  pFVar10 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar2 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar10 != pFVar2) {
    result = &data->page;
    do {
      for (seek_idx = (SkipListType *)pFVar10->start; seek_idx < (SkipListType *)pFVar10->end;
          seek_idx = (SkipListType *)((long)&seek_idx->_vptr_HeadNode + 1)) {
        puVar3 = (included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) ||
           ((puVar3[(ulong)seek_idx >> 6] >> ((ulong)seek_idx & 0x3f) & 1) != 0)) {
          pCVar4 = included->dmask;
          if (((SkipListType *)(pCVar4->scan).next_row_index <= seek_idx) ||
             (seek_idx < (SkipListType *)(pCVar4->scan).current_row_index)) {
            result_00 = &pCVar4->page;
            ColumnDataCollection::Seek(pCVar4->inputs,(idx_t)seek_idx,&pCVar4->scan,result_00);
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
            pCVar4->data = (double *)pvVar8->data;
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
            FlatVector::VerifyFlatVector(pvVar8);
            pCVar4->validity = &pvVar8->validity;
          }
          puVar3 = (pCVar4->validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar3 == (unsigned_long *)0x0) ||
             (uVar9 = (long)seek_idx - (pCVar4->scan).current_row_index,
             (puVar3[uVar9 >> 6 & 0x3ffffff] >> (uVar9 & 0x3f) & 1) != 0)) {
            if (((SkipListType *)(data->scan).next_row_index <= seek_idx) ||
               (seek_idx < (SkipListType *)(data->scan).current_row_index)) {
              ColumnDataCollection::Seek(data->inputs,(idx_t)seek_idx,&data->scan,result);
              pvVar8 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
              data->data = (double *)pvVar8->data;
              pvVar8 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
              FlatVector::VerifyFlatVector(pvVar8);
              data->validity = &pvVar8->validity;
            }
            local_48.data =
                 (CursorType *)
                 data->data[(uint)((int)seek_idx - (int)(data->scan).current_row_index)];
            local_48.skip = seek_idx;
            duckdb_skiplistlib::skip_list::
            HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
            ::insert(this_01,(pair<unsigned_long,_double> *)&local_48);
          }
        }
      }
      pFVar10 = pFVar10 + 1;
    } while (pFVar10 != pFVar2);
  }
  return;
}

Assistant:

void UpdateSkip(CursorType &data, const SubFrames &frames, IncludedType &included) {
		//	No overlap, or no data
		if (!s || prevs.back().end <= frames.front().start || frames.back().end <= prevs.front().start) {
			auto &skip = GetSkipList(true);
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						skip.insert(SkipType(i, data[i]));
					}
				}
			}
		} else {
			auto &skip = GetSkipList();
			SkipListUpdater updater(skip, data, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}
	}